

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpecParser::visitChar(TestSpecParser *this,char c)

{
  byte bVar1;
  size_t sVar2;
  char in_SIL;
  TestSpecParser *in_RDI;
  TestSpecParser *in_stack_000000d0;
  TestSpecParser *this_00;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  TestSpecParser *in_stack_ffffffffffffffc0;
  char local_9;
  
  local_9 = in_SIL;
  if (in_RDI->m_mode == None) {
    in_stack_ffffffffffffffb4 = (int)in_SIL;
    if (in_stack_ffffffffffffffb4 == 0x20) {
      return;
    }
    if (in_stack_ffffffffffffffb4 == 0x22) {
      sVar2 = in_RDI->m_pos + 1;
      in_RDI->m_pos = sVar2;
      startNewMode(in_RDI,QuotedName,sVar2);
      return;
    }
    if (in_stack_ffffffffffffffb4 == 0x5b) {
      sVar2 = in_RDI->m_pos + 1;
      in_RDI->m_pos = sVar2;
      startNewMode(in_RDI,Tag,sVar2);
      return;
    }
    if (in_stack_ffffffffffffffb4 == 0x5c) {
      escape((TestSpecParser *)CONCAT44(0x5c,in_stack_ffffffffffffffb0));
      return;
    }
    if (in_stack_ffffffffffffffb4 == 0x7e) {
      in_RDI->m_exclusion = true;
      return;
    }
    startNewMode(in_RDI,Name,in_RDI->m_pos);
  }
  if (in_RDI->m_mode == Name) {
    if (local_9 == ',') {
      addPattern<Catch::TestSpec::NamePattern>(in_stack_000000d0);
      addFilter(in_stack_ffffffffffffffc0);
    }
    else if (local_9 == '[') {
      this_00 = (TestSpecParser *)&stack0xffffffffffffffd0;
      subString_abi_cxx11_(this_00);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              (char *)this_00);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
      if ((bVar1 & 1) == 0) {
        addPattern<Catch::TestSpec::NamePattern>(in_stack_000000d0);
      }
      else {
        in_RDI->m_exclusion = true;
      }
      sVar2 = in_RDI->m_pos + 1;
      in_RDI->m_pos = sVar2;
      startNewMode(in_RDI,Tag,sVar2);
    }
    else if (local_9 == '\\') {
      escape((TestSpecParser *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    }
  }
  else if (in_RDI->m_mode == EscapedName) {
    in_RDI->m_mode = Name;
  }
  else if ((in_RDI->m_mode == QuotedName) && (local_9 == '\"')) {
    addPattern<Catch::TestSpec::NamePattern>(in_stack_000000d0);
  }
  else if ((in_RDI->m_mode == Tag) && (local_9 == ']')) {
    addPattern<Catch::TestSpec::TagPattern>(in_stack_000000d0);
  }
  return;
}

Assistant:

void TestSpecParser::visitChar( char c ) {
        if( m_mode == None ) {
            switch( c ) {
            case ' ': return;
            case '~': m_exclusion = true; return;
            case '[': return startNewMode( Tag, ++m_pos );
            case '"': return startNewMode( QuotedName, ++m_pos );
            case '\\': return escape();
            default: startNewMode( Name, m_pos ); break;
            }
        }
        if( m_mode == Name ) {
            if( c == ',' ) {
                addPattern<TestSpec::NamePattern>();
                addFilter();
            }
            else if( c == '[' ) {
                if( subString() == "exclude:" )
                    m_exclusion = true;
                else
                    addPattern<TestSpec::NamePattern>();
                startNewMode( Tag, ++m_pos );
            }
            else if( c == '\\' )
                escape();
        }
        else if( m_mode == EscapedName )
            m_mode = Name;
        else if( m_mode == QuotedName && c == '"' )
            addPattern<TestSpec::NamePattern>();
        else if( m_mode == Tag && c == ']' )
            addPattern<TestSpec::TagPattern>();
    }